

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::ProcessorProperty::ProcessorProperty
          (ProcessorProperty *this,CodeLocation *l,Property prop)

{
  CodeLocation local_30;
  Property local_1c;
  CodeLocation *pCStack_18;
  Property prop_local;
  CodeLocation *l_local;
  ProcessorProperty *this_local;
  
  local_1c = prop;
  pCStack_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_30,l);
  Expression::Expression(&this->super_Expression,&local_30);
  CodeLocation::~CodeLocation(&local_30);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__ProcessorProperty_0058b0a0;
  this->property = local_1c;
  getPropertyType(&this->type,local_1c);
  return;
}

Assistant:

ProcessorProperty (CodeLocation l, Property prop)
            : Expression (std::move (l)), property (prop),
              type (getPropertyType (prop))
        {
        }